

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_> * __thiscall
rcg::Device::getStreams(Device *this)

{
  ulong uVar1;
  bool bVar2;
  GC_ERROR GVar3;
  int iVar4;
  size_type sVar5;
  element_type *peVar6;
  undefined8 uVar7;
  pointer pwVar8;
  shared_ptr<rcg::Stream> *__r;
  long in_RSI;
  vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_> *in_RDI;
  size_t i_2;
  int k;
  size_t size;
  char tmp [256];
  uint32_t i_1;
  uint32_t n;
  shared_ptr<rcg::Stream> p;
  size_t i;
  vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_> current;
  lock_guard<std::mutex> lock;
  vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_> *ret;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_00000360;
  string *in_stack_00000368;
  GenTLException *in_stack_00000370;
  Stream *in_stack_fffffffffffffd48;
  string *in_stack_fffffffffffffd50;
  vector<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_> *this_00;
  vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
  *in_stack_fffffffffffffd58;
  pointer pwVar9;
  vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
  *in_stack_fffffffffffffd60;
  char *_id;
  shared_ptr<const_rcg::GenTLWrapper> *_gentl;
  shared_ptr<rcg::Device> *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  vector<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_> local_220;
  undefined1 local_201;
  allocator local_1d9;
  string local_1d8 [32];
  int local_1b8;
  undefined1 local_1b2;
  allocator local_1b1;
  string local_1b0 [32];
  size_t local_190;
  char local_188 [256];
  uint local_88;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  uint32_t local_60 [4];
  __shared_ptr local_50 [16];
  ulong local_40;
  vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_> local_38;
  undefined1 local_19;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffd50,
             (mutex_type *)in_stack_fffffffffffffd48);
  local_19 = 0;
  std::vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>::vector
            ((vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_> *
             )0x1491c0);
  if (*(long *)(in_RSI + 0x80) != 0) {
    std::vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>::
    vector((vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_> *)
           0x1491e3);
    for (local_40 = 0; uVar1 = local_40,
        sVar5 = std::
                vector<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>::
                size((vector<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>
                      *)(in_RSI + 0x118)), uVar1 < sVar5; local_40 = local_40 + 1) {
      std::vector<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>::
      operator[]((vector<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_> *
                 )(in_RSI + 0x118),local_40);
      std::weak_ptr<rcg::Stream>::lock((weak_ptr<rcg::Stream> *)in_stack_fffffffffffffd58);
      bVar2 = std::__shared_ptr::operator_cast_to_bool(local_50);
      if (bVar2) {
        std::vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>::
        push_back(in_stack_fffffffffffffd60,(value_type *)in_stack_fffffffffffffd58);
      }
      std::shared_ptr<rcg::Stream>::~shared_ptr((shared_ptr<rcg::Stream> *)0x1492ac);
    }
    local_60[0] = 0;
    peVar6 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1492e1);
    GVar3 = (*peVar6->DevGetNumDataStreams)(*(DEV_HANDLE *)(in_RSI + 0x80),local_60);
    if (GVar3 != 0) {
      local_82 = 1;
      uVar7 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,"Device::getStreams()",&local_81);
      GenTLException::GenTLException(in_stack_00000370,in_stack_00000368,in_stack_00000360);
      local_82 = 0;
      __cxa_throw(uVar7,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    for (local_88 = 0; local_88 < local_60[0]; local_88 = local_88 + 1) {
      _id = (char *)0x0;
      _gentl = (shared_ptr<const_rcg::GenTLWrapper> *)0x0;
      local_188[0xf0] = '\0';
      local_188[0xf1] = '\0';
      local_188[0xf2] = '\0';
      local_188[0xf3] = '\0';
      local_188[0xf4] = '\0';
      local_188[0xf5] = '\0';
      local_188[0xf6] = '\0';
      local_188[0xf7] = '\0';
      local_188[0xf8] = '\0';
      local_188[0xf9] = '\0';
      local_188[0xfa] = '\0';
      local_188[0xfb] = '\0';
      local_188[0xfc] = '\0';
      local_188[0xfd] = '\0';
      local_188[0xfe] = '\0';
      local_188[0xff] = '\0';
      local_188[0xe0] = '\0';
      local_188[0xe1] = '\0';
      local_188[0xe2] = '\0';
      local_188[0xe3] = '\0';
      local_188[0xe4] = '\0';
      local_188[0xe5] = '\0';
      local_188[0xe6] = '\0';
      local_188[0xe7] = '\0';
      local_188[0xe8] = '\0';
      local_188[0xe9] = '\0';
      local_188[0xea] = '\0';
      local_188[0xeb] = '\0';
      local_188[0xec] = '\0';
      local_188[0xed] = '\0';
      local_188[0xee] = '\0';
      local_188[0xef] = '\0';
      local_188[0xd0] = '\0';
      local_188[0xd1] = '\0';
      local_188[0xd2] = '\0';
      local_188[0xd3] = '\0';
      local_188[0xd4] = '\0';
      local_188[0xd5] = '\0';
      local_188[0xd6] = '\0';
      local_188[0xd7] = '\0';
      local_188[0xd8] = '\0';
      local_188[0xd9] = '\0';
      local_188[0xda] = '\0';
      local_188[0xdb] = '\0';
      local_188[0xdc] = '\0';
      local_188[0xdd] = '\0';
      local_188[0xde] = '\0';
      local_188[0xdf] = '\0';
      local_188[0xc0] = '\0';
      local_188[0xc1] = '\0';
      local_188[0xc2] = '\0';
      local_188[0xc3] = '\0';
      local_188[0xc4] = '\0';
      local_188[0xc5] = '\0';
      local_188[0xc6] = '\0';
      local_188[199] = '\0';
      local_188[200] = '\0';
      local_188[0xc9] = '\0';
      local_188[0xca] = '\0';
      local_188[0xcb] = '\0';
      local_188[0xcc] = '\0';
      local_188[0xcd] = '\0';
      local_188[0xce] = '\0';
      local_188[0xcf] = '\0';
      local_188[0xb0] = '\0';
      local_188[0xb1] = '\0';
      local_188[0xb2] = '\0';
      local_188[0xb3] = '\0';
      local_188[0xb4] = '\0';
      local_188[0xb5] = '\0';
      local_188[0xb6] = '\0';
      local_188[0xb7] = '\0';
      local_188[0xb8] = '\0';
      local_188[0xb9] = '\0';
      local_188[0xba] = '\0';
      local_188[0xbb] = '\0';
      local_188[0xbc] = '\0';
      local_188[0xbd] = '\0';
      local_188[0xbe] = '\0';
      local_188[0xbf] = '\0';
      local_188[0xa0] = '\0';
      local_188[0xa1] = '\0';
      local_188[0xa2] = '\0';
      local_188[0xa3] = '\0';
      local_188[0xa4] = '\0';
      local_188[0xa5] = '\0';
      local_188[0xa6] = '\0';
      local_188[0xa7] = '\0';
      local_188[0xa8] = '\0';
      local_188[0xa9] = '\0';
      local_188[0xaa] = '\0';
      local_188[0xab] = '\0';
      local_188[0xac] = '\0';
      local_188[0xad] = '\0';
      local_188[0xae] = '\0';
      local_188[0xaf] = '\0';
      local_188[0x90] = '\0';
      local_188[0x91] = '\0';
      local_188[0x92] = '\0';
      local_188[0x93] = '\0';
      local_188[0x94] = '\0';
      local_188[0x95] = '\0';
      local_188[0x96] = '\0';
      local_188[0x97] = '\0';
      local_188[0x98] = '\0';
      local_188[0x99] = '\0';
      local_188[0x9a] = '\0';
      local_188[0x9b] = '\0';
      local_188[0x9c] = '\0';
      local_188[0x9d] = '\0';
      local_188[0x9e] = '\0';
      local_188[0x9f] = '\0';
      local_188[0x80] = '\0';
      local_188[0x81] = '\0';
      local_188[0x82] = '\0';
      local_188[0x83] = '\0';
      local_188[0x84] = '\0';
      local_188[0x85] = '\0';
      local_188[0x86] = '\0';
      local_188[0x87] = '\0';
      local_188[0x88] = '\0';
      local_188[0x89] = '\0';
      local_188[0x8a] = '\0';
      local_188[0x8b] = '\0';
      local_188[0x8c] = '\0';
      local_188[0x8d] = '\0';
      local_188[0x8e] = '\0';
      local_188[0x8f] = '\0';
      local_188[0x70] = '\0';
      local_188[0x71] = '\0';
      local_188[0x72] = '\0';
      local_188[0x73] = '\0';
      local_188[0x74] = '\0';
      local_188[0x75] = '\0';
      local_188[0x76] = '\0';
      local_188[0x77] = '\0';
      local_188[0x78] = '\0';
      local_188[0x79] = '\0';
      local_188[0x7a] = '\0';
      local_188[0x7b] = '\0';
      local_188[0x7c] = '\0';
      local_188[0x7d] = '\0';
      local_188[0x7e] = '\0';
      local_188[0x7f] = '\0';
      local_188[0x60] = '\0';
      local_188[0x61] = '\0';
      local_188[0x62] = '\0';
      local_188[99] = '\0';
      local_188[100] = '\0';
      local_188[0x65] = '\0';
      local_188[0x66] = '\0';
      local_188[0x67] = '\0';
      local_188[0x68] = '\0';
      local_188[0x69] = '\0';
      local_188[0x6a] = '\0';
      local_188[0x6b] = '\0';
      local_188[0x6c] = '\0';
      local_188[0x6d] = '\0';
      local_188[0x6e] = '\0';
      local_188[0x6f] = '\0';
      local_188[0x50] = '\0';
      local_188[0x51] = '\0';
      local_188[0x52] = '\0';
      local_188[0x53] = '\0';
      local_188[0x54] = '\0';
      local_188[0x55] = '\0';
      local_188[0x56] = '\0';
      local_188[0x57] = '\0';
      local_188[0x58] = '\0';
      local_188[0x59] = '\0';
      local_188[0x5a] = '\0';
      local_188[0x5b] = '\0';
      local_188[0x5c] = '\0';
      local_188[0x5d] = '\0';
      local_188[0x5e] = '\0';
      local_188[0x5f] = '\0';
      local_188[0x40] = '\0';
      local_188[0x41] = '\0';
      local_188[0x42] = '\0';
      local_188[0x43] = '\0';
      local_188[0x44] = '\0';
      local_188[0x45] = '\0';
      local_188[0x46] = '\0';
      local_188[0x47] = '\0';
      local_188[0x48] = '\0';
      local_188[0x49] = '\0';
      local_188[0x4a] = '\0';
      local_188[0x4b] = '\0';
      local_188[0x4c] = '\0';
      local_188[0x4d] = '\0';
      local_188[0x4e] = '\0';
      local_188[0x4f] = '\0';
      local_188[0x30] = '\0';
      local_188[0x31] = '\0';
      local_188[0x32] = '\0';
      local_188[0x33] = '\0';
      local_188[0x34] = '\0';
      local_188[0x35] = '\0';
      local_188[0x36] = '\0';
      local_188[0x37] = '\0';
      local_188[0x38] = '\0';
      local_188[0x39] = '\0';
      local_188[0x3a] = '\0';
      local_188[0x3b] = '\0';
      local_188[0x3c] = '\0';
      local_188[0x3d] = '\0';
      local_188[0x3e] = '\0';
      local_188[0x3f] = '\0';
      local_188[0x20] = '\0';
      local_188[0x21] = '\0';
      local_188[0x22] = '\0';
      local_188[0x23] = '\0';
      local_188[0x24] = '\0';
      local_188[0x25] = '\0';
      local_188[0x26] = '\0';
      local_188[0x27] = '\0';
      local_188[0x28] = '\0';
      local_188[0x29] = '\0';
      local_188[0x2a] = '\0';
      local_188[0x2b] = '\0';
      local_188[0x2c] = '\0';
      local_188[0x2d] = '\0';
      local_188[0x2e] = '\0';
      local_188[0x2f] = '\0';
      local_188[0x10] = '\0';
      local_188[0x11] = '\0';
      local_188[0x12] = '\0';
      local_188[0x13] = '\0';
      local_188[0x14] = '\0';
      local_188[0x15] = '\0';
      local_188[0x16] = '\0';
      local_188[0x17] = '\0';
      local_188[0x18] = '\0';
      local_188[0x19] = '\0';
      local_188[0x1a] = '\0';
      local_188[0x1b] = '\0';
      local_188[0x1c] = '\0';
      local_188[0x1d] = '\0';
      local_188[0x1e] = '\0';
      local_188[0x1f] = '\0';
      local_188[0] = '\0';
      local_188[1] = '\0';
      local_188[2] = '\0';
      local_188[3] = '\0';
      local_188[4] = '\0';
      local_188[5] = '\0';
      local_188[6] = '\0';
      local_188[7] = '\0';
      local_188[8] = '\0';
      local_188[9] = '\0';
      local_188[10] = '\0';
      local_188[0xb] = '\0';
      local_188[0xc] = '\0';
      local_188[0xd] = '\0';
      local_188[0xe] = '\0';
      local_188[0xf] = '\0';
      local_190 = 0x100;
      peVar6 = std::
               __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1494d9);
      GVar3 = (*peVar6->DevGetDataStreamID)
                        (*(DEV_HANDLE *)(in_RSI + 0x80),local_88,local_188,&local_190);
      if (GVar3 != 0) {
        local_1b2 = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1b0,"Device::getStreams()",&local_1b1);
        GenTLException::GenTLException(in_stack_00000370,in_stack_00000368,in_stack_00000360);
        local_1b2 = 0;
        __cxa_throw(uVar7,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,local_188,&local_1d9);
      iVar4 = anon_unknown_6::find(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      local_1b8 = iVar4;
      if (iVar4 < 0) {
        in_stack_fffffffffffffd60 =
             (vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_> *
             )operator_new(0x108);
        local_201 = 1;
        std::enable_shared_from_this<rcg::Device>::shared_from_this
                  ((enable_shared_from_this<rcg::Device> *)in_stack_fffffffffffffd48);
        Stream::Stream((Stream *)CONCAT44(GVar3,in_stack_fffffffffffffda0),in_stack_fffffffffffffd98
                       ,_gentl,_id);
        local_201 = 0;
        std::shared_ptr<rcg::Stream>::shared_ptr<rcg::Stream,void>
                  ((shared_ptr<rcg::Stream> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        std::vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>::
        push_back((vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                   *)in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
        std::shared_ptr<rcg::Stream>::~shared_ptr((shared_ptr<rcg::Stream> *)0x149788);
        std::shared_ptr<rcg::Device>::~shared_ptr((shared_ptr<rcg::Device> *)0x149795);
      }
      else {
        std::vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>::
        operator[](&local_38,(long)iVar4);
        std::vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>::
        push_back(in_stack_fffffffffffffd60,(value_type *)in_stack_fffffffffffffd58);
      }
    }
    std::vector<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>::clear
              ((vector<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_> *)
               0x149838);
    local_220.
    super__Vector_base<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while (pwVar9 = local_220.
                    super__Vector_base<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
          pwVar8 = (pointer)std::
                            vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                            ::size(in_RDI), pwVar9 < pwVar8) {
      __r = (shared_ptr<rcg::Stream> *)(in_RSI + 0x118);
      std::vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>::
      operator[](in_RDI,(size_type)
                        local_220.
                        super__Vector_base<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_00 = &local_220;
      std::weak_ptr<rcg::Stream>::weak_ptr<rcg::Stream,void>((weak_ptr<rcg::Stream> *)this_00,__r);
      std::vector<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>::
      push_back(this_00,(value_type *)__r);
      std::weak_ptr<rcg::Stream>::~weak_ptr((weak_ptr<rcg::Stream> *)0x1498c8);
      local_220.
      super__Vector_base<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&((local_220.
                              super__Vector_base<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super___weak_ptr<rcg::Stream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1);
    }
    std::vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>::
    ~vector(in_stack_fffffffffffffd60);
  }
  local_19 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x149968);
  return in_RDI;
}

Assistant:

std::vector<std::shared_ptr<Stream> > Device::getStreams()
{
  std::lock_guard<std::mutex> lock(mtx);

  std::vector<std::shared_ptr<Stream> > ret;

  if (dev != 0)
  {
    // get list of previously requested streams that are still in use

    std::vector<std::shared_ptr<Stream> > current;

    for (size_t i=0; i<slist.size(); i++)
    {
      std::shared_ptr<Stream> p=slist[i].lock();
      if (p)
      {
        current.push_back(p);
      }
    }

    // create list of streams, using either existing streams or
    // instantiating new ones

    uint32_t n=0;
    if (gentl->DevGetNumDataStreams(dev, &n) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("Device::getStreams()", gentl);
    }

    for (uint32_t i=0; i<n; i++)
    {
      char tmp[256]="";
      size_t size=sizeof(tmp);

      if (gentl->DevGetDataStreamID(dev, i, tmp, &size) != GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException("Device::getStreams()", gentl);
      }

      int k=find(current, tmp);

      if (k >= 0)
      {
        ret.push_back(current[static_cast<size_t>(k)]);
      }
      else
      {
        ret.push_back(std::shared_ptr<Stream>(new Stream(shared_from_this(), gentl, tmp)));
      }
    }

    // update internal list of streams for reusage on next call

    slist.clear();
    for (size_t i=0; i<ret.size(); i++)
    {
      slist.push_back(ret[i]);
    }
  }

  return ret;

}